

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O1

void KeccakP1600_ExtractAndAddBytesInLane
               (void *state,uint lanePosition,uchar *input,uchar *output,uint offset,uint length)

{
  ulong uVar1;
  uint64_t lane1 [1];
  
  lane1[0] = *(uint64_t *)((long)state + (ulong)lanePosition * 8);
  if (length != 0) {
    uVar1 = 0;
    do {
      output[uVar1] = *(byte *)((long)lane1 + (ulong)(offset + (int)uVar1)) ^ input[uVar1];
      uVar1 = uVar1 + 1;
    } while (length != uVar1);
  }
  return;
}

Assistant:

void KeccakP1600_ExtractAndAddBytesInLane(const void *state, unsigned int lanePosition, const unsigned char *input, unsigned char *output, unsigned int offset, unsigned int length)
{
    uint64_t lane = ((uint64_t*)state)[lanePosition];
#ifdef KeccakP1600_useLaneComplementing
    if ((lanePosition == 1) || (lanePosition == 2) || (lanePosition == 8) || (lanePosition == 12) || (lanePosition == 17) || (lanePosition == 20))
        lane = ~lane;
#endif
#if (PLATFORM_BYTE_ORDER == IS_LITTLE_ENDIAN)
    {
        unsigned int i;
        uint64_t lane1[1];
        lane1[0] = lane;
        for(i=0; i<length; i++)
            output[i] = input[i] ^ ((uint8_t*)lane1)[offset+i];
    }
#else
    unsigned int i;
    lane >>= offset*8;
    for(i=0; i<length; i++) {
        output[i] = input[i] ^ (lane & 0xFF);
        lane >>= 8;
    }
#endif
}